

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_extract_component_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,uint32_t index)

{
  bool bVar1;
  char **in_R8;
  char (*in_R9) [2];
  char *local_58;
  undefined4 local_50;
  undefined1 local_40 [8];
  string expr;
  uint32_t index_local;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  expr.field_2._8_4_ = index;
  expr.field_2._12_4_ = id;
  to_enclosed_expression_abi_cxx11_((string *)local_40,this,id,true);
  bVar1 = Compiler::has_extended_decoration
                    (&this->super_Compiler,expr.field_2._12_4_,
                     SPIRVCrossDecorationPhysicalTypePacked);
  if (bVar1) {
    join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x623740,
               (char (*) [2])((long)&expr.field_2 + 8),(uint *)0x6629fd,in_R9);
  }
  else {
    local_58 = index_to_swizzle(this,expr.field_2._8_4_);
    join<std::__cxx11::string&,char_const(&)[2],char_const*>
              (__return_storage_ptr__,(spirv_cross *)local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x62c2d7,
               (char (*) [2])&local_58,in_R8);
  }
  local_50 = 1;
  ::std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_extract_component_expression(uint32_t id, uint32_t index)
{
	auto expr = to_enclosed_expression(id);
	if (has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked))
		return join(expr, "[", index, "]");
	else
		return join(expr, ".", index_to_swizzle(index));
}